

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionEntryPointInfo::ResetOnNativeCodeInstallFailure(FunctionEntryPointInfo *this)

{
  FunctionProxy *this_00;
  undefined8 *puVar1;
  int *piVar2;
  ScriptFunctionType *pSVar3;
  code *pcVar4;
  bool bVar5;
  void *pvVar6;
  undefined4 *puVar7;
  JavascriptMethod p_Var8;
  Type p_Var9;
  long lVar10;
  
  this_00 = (this->functionProxy).ptr;
  pvVar6 = FunctionProxy::GetAuxPtr(this_00,FunctionObjectTypeList);
  if ((pvVar6 != (void *)0x0) && (0 < *(int *)((long)pvVar6 + 0x10))) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar10 = 0;
    do {
      puVar1 = *(undefined8 **)(*(long *)((long)pvVar6 + 8) + lVar10 * 8);
      if ((((ulong)puVar1 & 1) == 0 && puVar1 != (undefined8 *)0x0) &&
         (piVar2 = (int *)*puVar1, piVar2 != (int *)0x0)) {
        if (*piVar2 != 0x1b) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x2413,"(functionType->GetTypeId() == TypeIds_Function)",
                                      "functionType->GetTypeId() == TypeIds_Function");
          if (!bVar5) goto LAB_0077f353;
          *puVar7 = 0;
        }
        if (*(FunctionEntryPointInfo **)(piVar2 + 0xe) == this) {
          if (((this->super_EntryPointInfo).field_0x18 & 8) == 0) {
            p_Var8 = GetCheckCodeGenThunk();
          }
          else {
            p_Var8 = GetCheckAsmJsCodeGenThunk();
          }
          *(JavascriptMethod *)(piVar2 + 6) = p_Var8;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)((long)pvVar6 + 0x10));
  }
  pSVar3 = (this_00->deferredPrototypeType).ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    if ((pSVar3->super_DynamicType).super_Type.typeId != TypeIds_Function) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x2413,"(functionType->GetTypeId() == TypeIds_Function)",
                                  "functionType->GetTypeId() == TypeIds_Function");
      if (!bVar5) goto LAB_0077f353;
      *puVar7 = 0;
    }
    if ((FunctionEntryPointInfo *)(pSVar3->entryPointInfo).ptr == this) {
      if (((this->super_EntryPointInfo).field_0x18 & 8) == 0) {
        p_Var9 = (Type)GetCheckCodeGenThunk();
      }
      else {
        p_Var9 = (Type)GetCheckAsmJsCodeGenThunk();
      }
      (pSVar3->super_DynamicType).super_Type.entryPoint = p_Var9;
    }
  }
  pSVar3 = (this_00->undeferredFunctionType).ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    if ((pSVar3->super_DynamicType).super_Type.typeId != TypeIds_Function) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x2413,"(functionType->GetTypeId() == TypeIds_Function)",
                                  "functionType->GetTypeId() == TypeIds_Function");
      if (!bVar5) {
LAB_0077f353:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    if ((FunctionEntryPointInfo *)(pSVar3->entryPointInfo).ptr == this) {
      if (((this->super_EntryPointInfo).field_0x18 & 8) == 0) {
        p_Var9 = (Type)GetCheckCodeGenThunk();
      }
      else {
        p_Var9 = (Type)GetCheckAsmJsCodeGenThunk();
      }
      (pSVar3->super_DynamicType).super_Type.entryPoint = p_Var9;
    }
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::ResetOnNativeCodeInstallFailure()
    {
        this->functionProxy->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);
            if (functionType->GetEntryPointInfo() == this)
            {
                if (!this->GetIsAsmJSFunction())
                {
                    functionType->SetEntryPoint(GetCheckCodeGenThunk());
                }
#ifdef ASMJS_PLAT
                else
                {
                    functionType->SetEntryPoint(GetCheckAsmJsCodeGenThunk());
                }
#endif
            }
        });
    }